

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::RegexpExtractFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  LogicalType varargs;
  LogicalType varargs_00;
  LogicalType varargs_01;
  LogicalType varargs_02;
  LogicalType varargs_03;
  ScalarFunctionSet *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  initializer_list<duckdb::LogicalType> __l_03;
  undefined4 in_stack_fffffffffffff744;
  undefined4 in_stack_fffffffffffff74c;
  FunctionNullHandling in_stack_fffffffffffff758;
  allocator_type local_8a1;
  bind_lambda_function_t in_stack_fffffffffffff760;
  LogicalType local_880 [4];
  code *local_820 [2];
  code *local_810;
  code *local_808;
  code *local_800 [2];
  code *local_7f0;
  code *local_7e8;
  code *local_7e0 [2];
  code *local_7d0;
  code *local_7c8;
  code *local_7c0 [2];
  code *local_7b0;
  code *local_7a8;
  code *local_7a0 [2];
  code *local_790;
  code *local_788;
  LogicalType local_780;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_768;
  LogicalType local_750;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_738;
  LogicalType local_720;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_708;
  LogicalType local_6f0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_6d8;
  LogicalType local_6c0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_6a8;
  LogicalType local_690;
  LogicalType local_678;
  LogicalType local_660;
  LogicalType local_648;
  LogicalType local_630;
  string local_618;
  ScalarFunction local_5f8;
  ScalarFunction local_4d0;
  ScalarFunction local_3a8;
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  ::std::__cxx11::string::string((string *)&local_618,"regexp_extract",(allocator *)local_880);
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_618);
  ::std::__cxx11::string::~string((string *)&local_618);
  LogicalType::LogicalType(local_880,VARCHAR);
  LogicalType::LogicalType(local_880 + 1,VARCHAR);
  __l._M_len = 2;
  __l._M_array = local_880;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_6a8,__l,(allocator_type *)&stack0xfffffffffffff760);
  LogicalType::LogicalType(&local_6c0,VARCHAR);
  local_7a0[1] = (code *)0x0;
  local_7a0[0] = RegexExtractFunction;
  local_788 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_790 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  LogicalType::LogicalType(&local_630,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_630;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffff744;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 1;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffff74c;
  ScalarFunction::ScalarFunction
            (&local_158,(vector<duckdb::LogicalType,_true> *)&local_6a8,&local_6c0,
             (scalar_function_t *)local_7a0,RegexExtractBind,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,RegexInitLocalState,varargs,CONSISTENT,
             in_stack_fffffffffffff758,in_stack_fffffffffffff760);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_158);
  ScalarFunction::~ScalarFunction(&local_158);
  LogicalType::~LogicalType(&local_630);
  ::std::_Function_base::~_Function_base((_Function_base *)local_7a0);
  LogicalType::~LogicalType(&local_6c0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_6a8);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_880[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  LogicalType::LogicalType(local_880,VARCHAR);
  LogicalType::LogicalType(local_880 + 1,VARCHAR);
  LogicalType::LogicalType(local_880 + 2,INTEGER);
  __l_00._M_len = 3;
  __l_00._M_array = local_880;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_6d8,__l_00,(allocator_type *)&stack0xfffffffffffff760);
  LogicalType::LogicalType(&local_6f0,VARCHAR);
  local_7c0[1] = (code *)0x0;
  local_7c0[0] = RegexExtractFunction;
  local_7a8 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_7b0 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  LogicalType::LogicalType(&local_648,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_00._0_8_ = &local_648;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff744;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 1;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff74c;
  ScalarFunction::ScalarFunction
            (&local_280,(vector<duckdb::LogicalType,_true> *)&local_6d8,&local_6f0,
             (scalar_function_t *)local_7c0,RegexExtractBind,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,RegexInitLocalState,varargs_00,CONSISTENT,
             in_stack_fffffffffffff758,in_stack_fffffffffffff760);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_280);
  ScalarFunction::~ScalarFunction(&local_280);
  LogicalType::~LogicalType(&local_648);
  ::std::_Function_base::~_Function_base((_Function_base *)local_7c0);
  LogicalType::~LogicalType(&local_6f0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_6d8);
  lVar1 = 0x30;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_880[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  LogicalType::LogicalType(local_880,VARCHAR);
  LogicalType::LogicalType(local_880 + 1,VARCHAR);
  LogicalType::LogicalType(local_880 + 2,INTEGER);
  LogicalType::LogicalType(local_880 + 3,VARCHAR);
  __l_01._M_len = 4;
  __l_01._M_array = local_880;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_708,__l_01,(allocator_type *)&stack0xfffffffffffff760);
  LogicalType::LogicalType(&local_720,VARCHAR);
  local_7e0[1] = (code *)0x0;
  local_7e0[0] = RegexExtractFunction;
  local_7c8 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_7d0 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  LogicalType::LogicalType(&local_660,INVALID);
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_01._0_8_ = &local_660;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff744;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 1;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff74c;
  ScalarFunction::ScalarFunction
            (&local_3a8,(vector<duckdb::LogicalType,_true> *)&local_708,&local_720,
             (scalar_function_t *)local_7e0,RegexExtractBind,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,RegexInitLocalState,varargs_01,CONSISTENT,
             in_stack_fffffffffffff758,in_stack_fffffffffffff760);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_3a8);
  ScalarFunction::~ScalarFunction(&local_3a8);
  LogicalType::~LogicalType(&local_660);
  ::std::_Function_base::~_Function_base((_Function_base *)local_7e0);
  LogicalType::~LogicalType(&local_720);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_708);
  lVar1 = 0x48;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_880[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  LogicalType::LogicalType(local_880,VARCHAR);
  LogicalType::LogicalType(local_880 + 1,VARCHAR);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff760,VARCHAR);
  LogicalType::LIST(local_880 + 2,(LogicalType *)&stack0xfffffffffffff760);
  __l_02._M_len = 3;
  __l_02._M_array = local_880;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_738,__l_02,&local_8a1);
  LogicalType::LogicalType(&local_750,VARCHAR);
  local_800[1] = (code *)0x0;
  local_800[0] = RegexExtractStructFunction;
  local_7e8 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_7f0 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  LogicalType::LogicalType(&local_678,INVALID);
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_02._0_8_ = &local_678;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff744;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 1;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff74c;
  ScalarFunction::ScalarFunction
            (&local_4d0,(vector<duckdb::LogicalType,_true> *)&local_738,&local_750,
             (scalar_function_t *)local_800,RegexExtractBind,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,RegexInitLocalState,varargs_02,CONSISTENT,
             in_stack_fffffffffffff758,in_stack_fffffffffffff760);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_4d0);
  ScalarFunction::~ScalarFunction(&local_4d0);
  LogicalType::~LogicalType(&local_678);
  ::std::_Function_base::~_Function_base((_Function_base *)local_800);
  LogicalType::~LogicalType(&local_750);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_738);
  lVar1 = 0x30;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_880[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffff760);
  LogicalType::LogicalType(local_880,VARCHAR);
  LogicalType::LogicalType(local_880 + 1,VARCHAR);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff760,VARCHAR);
  LogicalType::LIST(local_880 + 2,(LogicalType *)&stack0xfffffffffffff760);
  LogicalType::LogicalType(local_880 + 3,VARCHAR);
  __l_03._M_len = 4;
  __l_03._M_array = local_880;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_768,__l_03,&local_8a1);
  LogicalType::LogicalType(&local_780,VARCHAR);
  local_820[1] = (code *)0x0;
  local_820[0] = RegexExtractStructFunction;
  local_808 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_810 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  LogicalType::LogicalType(&local_690,INVALID);
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_03._0_8_ = &local_690;
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff744;
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 1;
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff74c;
  ScalarFunction::ScalarFunction
            (&local_5f8,(vector<duckdb::LogicalType,_true> *)&local_768,&local_780,
             (scalar_function_t *)local_820,RegexExtractBind,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,RegexInitLocalState,varargs_03,CONSISTENT,
             in_stack_fffffffffffff758,in_stack_fffffffffffff760);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_5f8);
  ScalarFunction::~ScalarFunction(&local_5f8);
  LogicalType::~LogicalType(&local_690);
  ::std::_Function_base::~_Function_base((_Function_base *)local_820);
  LogicalType::~LogicalType(&local_780);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_768);
  lVar1 = 0x48;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_880[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffff760);
  return in_RDI;
}

Assistant:

ScalarFunctionSet RegexpExtractFun::GetFunctions() {
	ScalarFunctionSet regexp_extract("regexp_extract");
	regexp_extract.AddFunction(ScalarFunction({LogicalType::VARCHAR, LogicalType::VARCHAR}, LogicalType::VARCHAR,
	                                          RegexExtractFunction, RegexExtractBind, nullptr, nullptr,
	                                          RegexInitLocalState, LogicalType::INVALID, FunctionStability::CONSISTENT,
	                                          FunctionNullHandling::SPECIAL_HANDLING));
	regexp_extract.AddFunction(ScalarFunction({LogicalType::VARCHAR, LogicalType::VARCHAR, LogicalType::INTEGER},
	                                          LogicalType::VARCHAR, RegexExtractFunction, RegexExtractBind, nullptr,
	                                          nullptr, RegexInitLocalState, LogicalType::INVALID,
	                                          FunctionStability::CONSISTENT, FunctionNullHandling::SPECIAL_HANDLING));
	regexp_extract.AddFunction(ScalarFunction(
	    {LogicalType::VARCHAR, LogicalType::VARCHAR, LogicalType::INTEGER, LogicalType::VARCHAR}, LogicalType::VARCHAR,
	    RegexExtractFunction, RegexExtractBind, nullptr, nullptr, RegexInitLocalState, LogicalType::INVALID,
	    FunctionStability::CONSISTENT, FunctionNullHandling::SPECIAL_HANDLING));
	// REGEXP_EXTRACT(<string>, <pattern>, [<group 1 name>[, <group n name>]...])
	regexp_extract.AddFunction(ScalarFunction(
	    {LogicalType::VARCHAR, LogicalType::VARCHAR, LogicalType::LIST(LogicalType::VARCHAR)}, LogicalType::VARCHAR,
	    RegexExtractStructFunction, RegexExtractBind, nullptr, nullptr, RegexInitLocalState, LogicalType::INVALID,
	    FunctionStability::CONSISTENT, FunctionNullHandling::SPECIAL_HANDLING));
	// REGEXP_EXTRACT(<string>, <pattern>, [<group 1 name>[, <group n name>]...], <options>)
	regexp_extract.AddFunction(ScalarFunction(
	    {LogicalType::VARCHAR, LogicalType::VARCHAR, LogicalType::LIST(LogicalType::VARCHAR), LogicalType::VARCHAR},
	    LogicalType::VARCHAR, RegexExtractStructFunction, RegexExtractBind, nullptr, nullptr, RegexInitLocalState,
	    LogicalType::INVALID, FunctionStability::CONSISTENT, FunctionNullHandling::SPECIAL_HANDLING));
	return (regexp_extract);
}